

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t parse_op_parameters_info(aom_read_bit_buffer *rb,int buffer_delay_length_minus_1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t low_delay_mode_flag;
  uint32_t encoder_buffer_delay;
  uint32_t decoder_buffer_delay;
  int n;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  uVar1 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  uVar2 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(uVar1,uVar2));
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t parse_op_parameters_info(
    struct aom_read_bit_buffer *rb, int buffer_delay_length_minus_1) {
  const int n = buffer_delay_length_minus_1 + 1;
  const uint32_t decoder_buffer_delay = aom_rb_read_unsigned_literal(rb, n);
  const uint32_t encoder_buffer_delay = aom_rb_read_unsigned_literal(rb, n);
  const uint8_t low_delay_mode_flag = aom_rb_read_bit(rb);
  (void)decoder_buffer_delay;
  (void)encoder_buffer_delay;
  (void)low_delay_mode_flag;
  return AOM_CODEC_OK;
}